

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O1

reference __thiscall
QVLABase<QRhiGles2::Scratch::SeparateSampler>::
emplace_back_impl<QRhiGles2::Scratch::SeparateSampler>
          (QVLABase<QRhiGles2::Scratch::SeparateSampler> *this,qsizetype prealloc,void *array,
          SeparateSampler *args)

{
  qsizetype *pqVar1;
  undefined8 *puVar2;
  void *pvVar3;
  undefined8 uVar4;
  long lVar5;
  long aalloc;
  
  lVar5 = (this->super_QVLABaseBase).s;
  if (lVar5 == (this->super_QVLABaseBase).a) {
    aalloc = lVar5 + 1;
    if (lVar5 + 1 < lVar5 * 2) {
      aalloc = lVar5 * 2;
    }
    reallocate_impl(this,prealloc,array,lVar5,aalloc);
  }
  pvVar3 = (this->super_QVLABaseBase).ptr;
  lVar5 = (this->super_QVLABaseBase).s * 0x10;
  uVar4 = *(undefined8 *)&args->binding;
  puVar2 = (undefined8 *)((long)pvVar3 + lVar5);
  *puVar2 = args->sampler;
  puVar2[1] = uVar4;
  pqVar1 = &(this->super_QVLABaseBase).s;
  *pqVar1 = *pqVar1 + 1;
  return (reference)((long)pvVar3 + lVar5);
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }